

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

void libtorrent::apply_pack_impl
               (settings_pack *pack,session_settings_single_thread *sett,
               vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
               *callbacks)

{
  ushort uVar1;
  ushort uVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  __type_conflict1 _Var6;
  bool bVar7;
  uint uVar8;
  string *__lhs;
  __normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
  _Var9;
  pair<unsigned_short,_int> *p;
  pointer ppVar10;
  pointer ppVar11;
  pointer ppVar12;
  string local_50;
  
  ppVar3 = (pack->m_strings).
           super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar12 = (pack->m_strings).
                 super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar3; ppVar12 = ppVar12 + 1
      ) {
    uVar1 = ppVar12->first;
    if (uVar1 < 0xd) {
      __lhs = aux::session_settings_single_thread::get_str_abi_cxx11_(sett,(uint)uVar1);
      _Var6 = ::std::operator==(__lhs,&ppVar12->second);
      if (!_Var6) {
        uVar2 = ppVar12->first;
        ::std::__cxx11::string::string((string *)&local_50,(string *)&ppVar12->second);
        aux::session_settings_single_thread::set_str(sett,(uint)uVar2,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        if ((callbacks !=
             (vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
              *)0x0) && (*(long *)(&DAT_004d8900 + (ulong)uVar1 * 0x38) != 0)) {
          _Var9 = ::std::
                  __find_if<__gnu_cxx::__normal_iterator<void(libtorrent::aux::session_impl::**)(),std::vector<void(libtorrent::aux::session_impl::*)(),std::allocator<void(libtorrent::aux::session_impl::*)()>>>,__gnu_cxx::__ops::_Iter_equals_val<void(libtorrent::aux::session_impl::*const)()>>
                            ((callbacks->
                             super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (callbacks->
                             super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                             )._M_impl.super__Vector_impl_data._M_finish,
                             &DAT_004d8900 + (ulong)uVar1 * 0x38);
          if (_Var9._M_current ==
              (callbacks->
              super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            ::std::
            vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
            ::push_back(callbacks,(value_type *)(&DAT_004d8900 + (ulong)uVar1 * 0x38));
          }
        }
      }
    }
  }
  ppVar4 = (pack->m_ints).
           super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar10 = (pack->m_ints).
                 super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar4; ppVar10 = ppVar10 + 1
      ) {
    if ((ppVar10->first & 0xc000) == 0x4000) {
      uVar8 = ppVar10->first & 0x3fff;
      if (uVar8 < 0x9f) {
        if ((((sett->m_ints)._M_elems[uVar8] != ppVar10->second) &&
            ((sett->m_ints)._M_elems[uVar8] = ppVar10->second,
            callbacks !=
            (vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
             *)0x0)) && (*(long *)(&DAT_004ce208 + (uVar8 << 5)) != 0)) {
          _Var9 = ::std::
                  __find_if<__gnu_cxx::__normal_iterator<void(libtorrent::aux::session_impl::**)(),std::vector<void(libtorrent::aux::session_impl::*)(),std::allocator<void(libtorrent::aux::session_impl::*)()>>>,__gnu_cxx::__ops::_Iter_equals_val<void(libtorrent::aux::session_impl::*const)()>>
                            ((callbacks->
                             super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (callbacks->
                             super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                             )._M_impl.super__Vector_impl_data._M_finish,
                             &DAT_004ce208 + (uVar8 << 5));
          if (_Var9._M_current ==
              (callbacks->
              super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            ::std::
            vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
            ::push_back(callbacks,(value_type *)(&DAT_004ce208 + (uVar8 << 5)));
          }
        }
      }
    }
  }
  ppVar5 = (pack->m_bools).
           super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar11 = (pack->m_bools).
                 super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar5; ppVar11 = ppVar11 + 1
      ) {
    uVar1 = ppVar11->first;
    if (((uVar1 & 0xc000) == 0x8000) && ((uVar1 & 0x3fff) < 0x54)) {
      bVar7 = aux::session_settings_single_thread::get_bool(sett,(uint)uVar1);
      if (ppVar11->second != bVar7) {
        aux::session_settings_single_thread::set_bool(sett,(uint)ppVar11->first,ppVar11->second);
        if ((callbacks !=
             (vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
              *)0x0) && (uVar8 = (uVar1 & 0x3fff) << 5, *(long *)(&DAT_004cf5e8 + uVar8) != 0)) {
          _Var9 = ::std::
                  __find_if<__gnu_cxx::__normal_iterator<void(libtorrent::aux::session_impl::**)(),std::vector<void(libtorrent::aux::session_impl::*)(),std::allocator<void(libtorrent::aux::session_impl::*)()>>>,__gnu_cxx::__ops::_Iter_equals_val<void(libtorrent::aux::session_impl::*const)()>>
                            ((callbacks->
                             super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (callbacks->
                             super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                             )._M_impl.super__Vector_impl_data._M_finish,&DAT_004cf5e8 + uVar8);
          if (_Var9._M_current ==
              (callbacks->
              super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            ::std::
            vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
            ::push_back(callbacks,(value_type *)(&DAT_004cf5e8 + uVar8));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void apply_pack_impl(settings_pack const* pack, aux::session_settings_single_thread& sett
		, std::vector<void(aux::session_impl::*)()>* callbacks)
	{
		for (auto const& p : pack->m_strings)
		{
			// disregard setting indices that are not string types
			if ((p.first & settings_pack::type_mask) != settings_pack::string_type_base)
				continue;

			// ignore settings that are out of bounds
			int const index = p.first & settings_pack::index_mask;
			TORRENT_ASSERT_PRECOND(index >= 0 && index < settings_pack::num_string_settings);
			if (index < 0 || index >= settings_pack::num_string_settings)
				continue;

			// if the value did not change, don't call the update callback
			if (sett.get_str(p.first) == p.second) continue;

			sett.set_str(p.first, p.second);
			str_setting_entry_t const& sa = str_settings[index];

			if (sa.fun && callbacks
				&& std::find(callbacks->begin(), callbacks->end(), sa.fun) == callbacks->end())
				callbacks->push_back(sa.fun);
		}

		for (auto const& p : pack->m_ints)
		{
			// disregard setting indices that are not int types
			if ((p.first & settings_pack::type_mask) != settings_pack::int_type_base)
				continue;

			// ignore settings that are out of bounds
			int const index = p.first & settings_pack::index_mask;
			TORRENT_ASSERT_PRECOND(index >= 0 && index < settings_pack::num_int_settings);
			if (index < 0 || index >= settings_pack::num_int_settings)
				continue;

			// if the value did not change, don't call the update callback
			if (sett.get_int(p.first) == p.second) continue;

			sett.set_int(p.first, p.second);
			int_setting_entry_t const& sa = int_settings[index];
			if (sa.fun && callbacks
				&& std::find(callbacks->begin(), callbacks->end(), sa.fun) == callbacks->end())
				callbacks->push_back(sa.fun);
		}

		for (auto const& p : pack->m_bools)
		{
			// disregard setting indices that are not bool types
			if ((p.first & settings_pack::type_mask) != settings_pack::bool_type_base)
				continue;

			// ignore settings that are out of bounds
			int const index = p.first & settings_pack::index_mask;
			TORRENT_ASSERT_PRECOND(index >= 0 && index < settings_pack::num_bool_settings);
			if (index < 0 || index >= settings_pack::num_bool_settings)
				continue;

			// if the value did not change, don't call the update callback
			if (sett.get_bool(p.first) == p.second) continue;

			sett.set_bool(p.first, p.second);
			bool_setting_entry_t const& sa = bool_settings[index];
			if (sa.fun && callbacks
				&& std::find(callbacks->begin(), callbacks->end(), sa.fun) == callbacks->end())
				callbacks->push_back(sa.fun);
		}
	}